

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O0

int32 count_triphones(char *transfile,dicthashelement_t **dicthash,hashelement_t **tphnhash,
                     phnhashelement_t ***phnhash,int ignore_wpos)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  phnhashelement_t **hashtable;
  char *__s;
  char *pcVar3;
  void *__ptr;
  dicthashelement_t *pdVar4;
  size_t sVar5;
  char *pcVar6;
  phnhashelement_t *ppVar7;
  hashelement_t *phVar8;
  FILE *fp;
  hashelement_t *tphnptr;
  phnhashelement_t *phnptr;
  phnhashelement_t **lphnhash;
  dicthashelement_t **wordarr;
  int32 j;
  int32 i;
  char *wpos;
  char *pcStack_78;
  char silencephn [4];
  char *rctxt;
  char *lctxt;
  char *basephone;
  char *word;
  char *tline;
  lineiter_t *line;
  int32 n_totalwds;
  int32 lnphns;
  int32 nwords;
  int32 nswdtphns;
  int32 niwdtphns;
  int32 newdtphns;
  int32 nbwdtphns;
  int ignore_wpos_local;
  phnhashelement_t ***phnhash_local;
  hashelement_t **tphnhash_local;
  dicthashelement_t **dicthash_local;
  char *transfile_local;
  
  strcpy((char *)((long)&wpos + 4),"SIL");
  __stream = fopen(transfile,"r");
  if (__stream != (FILE *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x1df,"Out of vocabulary words in transcript will be mapped to SIL!\n");
    hashtable = (phnhashelement_t **)calloc(0x65,0x18);
    line._0_4_ = 0;
    lnphns = 0;
    nwords = 0;
    nswdtphns = 0;
    niwdtphns = 0;
    for (tline = (char *)lineiter_start_clean((FILE *)__stream); tline != (char *)0x0;
        tline = (char *)lineiter_next((lineiter_t *)tline)) {
      __s = strdup(*(char **)tline);
      pcVar3 = strtok(__s," \t\n");
      if (pcVar3 == (char *)0x0) {
        free(__s);
      }
      else {
        n_totalwds = 1;
        while (pcVar3 = strtok((char *)0x0," \t\n"), pcVar3 != (char *)0x0) {
          n_totalwds = n_totalwds + 1;
        }
        line._0_4_ = n_totalwds + (uint)line;
        __ptr = __ckd_calloc__((long)(n_totalwds + 2),8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                               ,0x1f1);
        pcVar3 = strtok(*(char **)tline," \t\n");
        pdVar4 = dictlookup(pcVar3,dicthash);
        *(dicthashelement_t **)((long)__ptr + 8) = pdVar4;
        if (pdVar4 == (dicthashelement_t *)0x0) {
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                  ,500,"Word %s not found in dictionary. Mapping to SIL.\n",pcVar3);
        }
        wordarr._0_4_ = 2;
        while (pcVar3 = strtok((char *)0x0," \t\n"), pcVar3 != (char *)0x0) {
          pdVar4 = dictlookup(pcVar3,dicthash);
          *(dicthashelement_t **)((long)__ptr + (long)(int)wordarr * 8) = pdVar4;
          if (((pdVar4 == (dicthashelement_t *)0x0) && (*pcVar3 != '(')) &&
             (sVar5 = strlen(pcVar3), pcVar3[sVar5 - 1] != ')')) {
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                    ,0x1fb,"Word %s not found in dictionary. Mapping to SIL.\n",pcVar3);
          }
          wordarr._0_4_ = (int)wordarr + 1;
        }
        for (wordarr._4_4_ = 1; wordarr._4_4_ <= n_totalwds; wordarr._4_4_ = wordarr._4_4_ + 1) {
          if (*(long *)((long)__ptr + (long)wordarr._4_4_ * 8) != 0) {
            iVar1 = *(int *)(*(long *)((long)__ptr + (long)wordarr._4_4_ * 8) + 0x10);
            if (iVar1 == 1) {
              pcVar6 = wordpos2str(WORD_POSN_SINGLE,ignore_wpos);
              pcVar3 = (char *)**(undefined8 **)
                                 (*(long *)((long)__ptr + (long)wordarr._4_4_ * 8) + 8);
              ppVar7 = phninstall(pcVar3,hashtable);
              ppVar7->count = ppVar7->count + 1;
              if ((*pcVar3 != '+') && (iVar1 = strcmp(pcVar3,"SIL"), iVar1 != 0)) {
                if (*(long *)((long)__ptr + (long)(wordarr._4_4_ + -1) * 8) == 0) {
                  rctxt = (char *)((long)&wpos + 4);
                }
                else {
                  rctxt = *(char **)(*(long *)(*(long *)((long)__ptr +
                                                        (long)(wordarr._4_4_ + -1) * 8) + 8) +
                                    (long)(*(int *)(*(long *)((long)__ptr +
                                                             (long)(wordarr._4_4_ + -1) * 8) + 0x10)
                                          + -1) * 8);
                  if ((*rctxt == '+') || (iVar1 = strcmp(rctxt,"SIL"), iVar1 == 0)) {
                    rctxt = (char *)((long)&wpos + 4);
                  }
                }
                if (*(long *)((long)__ptr + (long)(wordarr._4_4_ + 1) * 8) == 0) {
                  pcStack_78 = (char *)((long)&wpos + 4);
                }
                else {
                  pcStack_78 = (char *)**(undefined8 **)
                                         (*(long *)((long)__ptr + (long)(wordarr._4_4_ + 1) * 8) + 8
                                         );
                  if ((*pcStack_78 == '+') || (iVar1 = strcmp(pcStack_78,"SIL"), iVar1 == 0)) {
                    pcStack_78 = (char *)((long)&wpos + 4);
                  }
                }
                phVar8 = lookup(pcVar3,rctxt,pcStack_78,pcVar6,tphnhash);
                phVar8->count = phVar8->count + 1;
                lnphns = lnphns + 1;
              }
            }
            else {
              pcVar6 = wordpos2str(WORD_POSN_BEGIN,ignore_wpos);
              pcVar3 = (char *)**(undefined8 **)
                                 (*(long *)((long)__ptr + (long)wordarr._4_4_ * 8) + 8);
              ppVar7 = phninstall(pcVar3,hashtable);
              ppVar7->count = ppVar7->count + 1;
              if ((*pcVar3 != '+') && (iVar2 = strcmp(pcVar3,"SIL"), iVar2 != 0)) {
                if ((*pcVar3 != '+') && (iVar2 = strcmp(pcVar3,"SIL"), iVar2 != 0)) {
                  if (*(long *)((long)__ptr + (long)(wordarr._4_4_ + -1) * 8) == 0) {
                    rctxt = (char *)((long)&wpos + 4);
                  }
                  else {
                    rctxt = *(char **)(*(long *)(*(long *)((long)__ptr +
                                                          (long)(wordarr._4_4_ + -1) * 8) + 8) +
                                      (long)(*(int *)(*(long *)((long)__ptr +
                                                               (long)(wordarr._4_4_ + -1) * 8) +
                                                     0x10) + -1) * 8);
                    if ((*rctxt == '+') || (iVar2 = strcmp(rctxt,"SIL"), iVar2 == 0)) {
                      rctxt = (char *)((long)&wpos + 4);
                    }
                  }
                  pcStack_78 = *(char **)(*(long *)(*(long *)((long)__ptr + (long)wordarr._4_4_ * 8)
                                                   + 8) + 8);
                  if ((*pcStack_78 == '+') || (iVar2 = strcmp(pcStack_78,"SIL"), iVar2 == 0)) {
                    pcStack_78 = (char *)((long)&wpos + 4);
                  }
                  phVar8 = lookup(pcVar3,rctxt,pcStack_78,pcVar6,tphnhash);
                  phVar8->count = phVar8->count + 1;
                  niwdtphns = niwdtphns + 1;
                }
                pcVar3 = wordpos2str(WORD_POSN_INTERNAL,ignore_wpos);
                for (wordarr._0_4_ = 1; (int)wordarr < iVar1 + -1; wordarr._0_4_ = (int)wordarr + 1)
                {
                  pcVar6 = *(char **)(*(long *)(*(long *)((long)__ptr + (long)wordarr._4_4_ * 8) + 8
                                               ) + (long)(int)wordarr * 8);
                  ppVar7 = phninstall(pcVar6,hashtable);
                  ppVar7->count = ppVar7->count + 1;
                  if ((*pcVar6 != '+') && (iVar2 = strcmp(pcVar6,"SIL"), iVar2 != 0)) {
                    rctxt = *(char **)(*(long *)(*(long *)((long)__ptr + (long)wordarr._4_4_ * 8) +
                                                8) + (long)((int)wordarr + -1) * 8);
                    if ((*rctxt == '+') || (iVar2 = strcmp(rctxt,"SIL"), iVar2 == 0)) {
                      rctxt = (char *)((long)&wpos + 4);
                    }
                    pcStack_78 = *(char **)(*(long *)(*(long *)((long)__ptr +
                                                               (long)wordarr._4_4_ * 8) + 8) +
                                           (long)((int)wordarr + 1) * 8);
                    if ((*pcStack_78 == '+') || (iVar2 = strcmp(pcStack_78,"SIL"), iVar2 == 0)) {
                      pcStack_78 = (char *)((long)&wpos + 4);
                    }
                    phVar8 = lookup(pcVar6,rctxt,pcStack_78,pcVar3,tphnhash);
                    phVar8->count = phVar8->count + 1;
                    nwords = nwords + 1;
                  }
                }
                pcVar6 = wordpos2str(WORD_POSN_END,ignore_wpos);
                pcVar3 = *(char **)(*(long *)(*(long *)((long)__ptr + (long)wordarr._4_4_ * 8) + 8)
                                   + (long)(iVar1 + -1) * 8);
                ppVar7 = phninstall(pcVar3,hashtable);
                ppVar7->count = ppVar7->count + 1;
                if ((*pcVar3 != '+') && (iVar2 = strcmp(pcVar3,"SIL"), iVar2 != 0)) {
                  rctxt = *(char **)(*(long *)(*(long *)((long)__ptr + (long)wordarr._4_4_ * 8) + 8)
                                    + (long)(iVar1 + -2) * 8);
                  if ((*rctxt == '+') || (iVar1 = strcmp(rctxt,"SIL"), iVar1 == 0)) {
                    rctxt = (char *)((long)&wpos + 4);
                  }
                  if (*(long *)((long)__ptr + (long)(wordarr._4_4_ + 1) * 8) == 0) {
                    pcStack_78 = (char *)((long)&wpos + 4);
                  }
                  else {
                    pcStack_78 = (char *)**(undefined8 **)
                                           (*(long *)((long)__ptr + (long)(wordarr._4_4_ + 1) * 8) +
                                           8);
                    if ((*pcStack_78 == '+') || (iVar1 = strcmp(pcStack_78,"SIL"), iVar1 == 0)) {
                      pcStack_78 = (char *)((long)&wpos + 4);
                    }
                  }
                  phVar8 = lookup(pcVar3,rctxt,pcStack_78,pcVar6,tphnhash);
                  phVar8->count = phVar8->count + 1;
                  nswdtphns = nswdtphns + 1;
                }
              }
            }
          }
        }
        free(__ptr);
        free(__s);
      }
    }
    fclose(__stream);
    lineiter_free((lineiter_t *)0x0);
    *phnhash = hashtable;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x251,"%d words in transcripts\n",(ulong)(uint)line);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x252,"%d single word triphones in transcripts\n",(ulong)(uint)lnphns);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x253,"%d word beginning triphones in transcripts\n",(ulong)(uint)niwdtphns);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x254,"%d word internal triphones in transcripts\n",(ulong)(uint)nwords);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x255,"%d word ending triphones in transcripts\n",(ulong)(uint)nswdtphns);
    return 0;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
          ,0x1dd,"Unable to open transcript file %s for reading!\n",transfile);
  exit(1);
}

Assistant:

int32  count_triphones (const char *transfile,
			dicthashelement_t **dicthash,
			hashelement_t **tphnhash,
			phnhashelement_t ***phnhash,
			int ignore_wpos)
{
    int32  nbwdtphns, newdtphns, niwdtphns, nswdtphns;
    int32  nwords, lnphns, n_totalwds;
    lineiter_t *line = NULL;
    char *tline;
    char   *word, *basephone, *lctxt, *rctxt; 
    char   silencephn[4];
    const char* wpos;
    int32  i, j;
    dicthashelement_t **wordarr;
    phnhashelement_t **lphnhash, *phnptr;
    hashelement_t *tphnptr;
    FILE   *fp;

    strcpy(silencephn,"SIL");
    if ((fp = fopen(transfile,"r")) == NULL)
	E_FATAL("Unable to open transcript file %s for reading!\n",transfile);

    E_INFO("Out of vocabulary words in transcript will be mapped to SIL!\n");

    lphnhash = (phnhashelement_t**)calloc(PHNHASHSIZE,sizeof(phnhashelement_t));

    n_totalwds = 0;
    nbwdtphns = newdtphns = niwdtphns = nswdtphns = 0;

    for (line = lineiter_start_clean(fp); line; line = lineiter_next(line)) {

	tline = strdup(line->buf);
        if (strtok(tline," \t\n") == NULL) {
           free(tline);
    	   continue;
        }

        /* Count number of phones in pronunciation */
        for(nwords=1; strtok(NULL," \t\n") != NULL; nwords++);
	n_totalwds += nwords;
	wordarr = (dicthashelement_t **)ckd_calloc(nwords+2,sizeof(dicthashelement_t*));
        word = strtok(line->buf," \t\n"); 
        if ((wordarr[1] = dictlookup(word,dicthash)) == NULL) {
            E_WARN("Word %s not found in dictionary. Mapping to SIL.\n", word);
        }
        for (j=2; (word = strtok(NULL," \t\n")) != NULL; j++) {
            if ((wordarr[j] = dictlookup(word,dicthash)) == NULL) {
                /* If word is surrounded by "()", assume it's the
                 * utterance ID, and don't report it as an OOV */
                if ((word[0] != '(') && (word[strlen(word) - 1] != ')')) {
                    E_WARN("Word %s not found in dictionary. Mapping to SIL.\n", word);
                }
            }
        }       
	for (i=1; i<=nwords; i++){/* Indices account for padded wordarr array */
	    if (wordarr[i] == NULL) continue;

	    lnphns = wordarr[i]->nphns;
	    if (lnphns == 1) {
		wpos = wordpos2str(WORD_POSN_SINGLE, ignore_wpos);
		basephone = wordarr[i]->phones[0];
		phnptr = phninstall(basephone,lphnhash);
		phnptr->count++;
		if (IS_FILLER(basephone)) continue;
		if (wordarr[i-1] != NULL){
		    lctxt = wordarr[i-1]->phones[wordarr[i-1]->nphns - 1];
		    if (IS_FILLER(lctxt)) lctxt = silencephn;
		}
		else lctxt = silencephn;
		if (wordarr[i+1] != NULL){
		    rctxt = wordarr[i+1]->phones[0];
		    if (IS_FILLER(rctxt)) rctxt = silencephn;
		}
		else rctxt = silencephn;
		tphnptr = lookup(basephone,lctxt,rctxt,wpos,tphnhash);
		(tphnptr->count)++;
		nswdtphns++;
	    }
	    else {
		wpos = wordpos2str(WORD_POSN_BEGIN, ignore_wpos);
		basephone = wordarr[i]->phones[0];
		phnptr = phninstall(basephone,lphnhash);
		phnptr->count++;
		if (IS_FILLER(basephone)) continue;
                if (!IS_FILLER(basephone)){
		    if (wordarr[i-1] != NULL){
		        lctxt = wordarr[i-1]->phones[wordarr[i-1]->nphns - 1];
		        if (IS_FILLER(lctxt)) lctxt = silencephn;
		    }
		    else lctxt = silencephn;
		    rctxt = wordarr[i]->phones[1];
		    if (IS_FILLER(rctxt)) rctxt = silencephn;
		    tphnptr = lookup(basephone,lctxt,rctxt,wpos,tphnhash);
		    (tphnptr->count)++; 
                    nbwdtphns++;
	        }
		wpos = wordpos2str(WORD_POSN_INTERNAL, ignore_wpos);
		for (j=1;j<lnphns-1;j++){
		    basephone = wordarr[i]->phones[j];
		    phnptr = phninstall(basephone,lphnhash);
		    phnptr->count++;
		    if (IS_FILLER(basephone)) continue;
		    lctxt = wordarr[i]->phones[j-1];
		    if (IS_FILLER(lctxt)) lctxt = silencephn;
		    rctxt = wordarr[i]->phones[j+1];
		    if (IS_FILLER(rctxt)) rctxt = silencephn;
		    tphnptr = lookup(basephone,lctxt,rctxt,wpos,tphnhash);
		    (tphnptr->count)++;
		    niwdtphns++;
		}

		wpos = wordpos2str(WORD_POSN_END, ignore_wpos);
		basephone = wordarr[i]->phones[lnphns-1];
		phnptr = phninstall(basephone,lphnhash);
		phnptr->count++;
		if (IS_FILLER(basephone)) continue;

		lctxt = wordarr[i]->phones[lnphns-2];
		if (IS_FILLER(lctxt)) lctxt = silencephn;
		if (wordarr[i+1] != NULL){
		    rctxt = wordarr[i+1]->phones[0];
		    if (IS_FILLER(rctxt)) rctxt = silencephn;
		}
		else rctxt = silencephn;
		tphnptr = lookup(basephone,lctxt,rctxt,wpos,tphnhash);
		(tphnptr->count)++;
		newdtphns++;
	    }
	}
        free(wordarr);
        free(tline);
    }
    fclose(fp);
    lineiter_free(line);

    *phnhash = lphnhash;
    E_INFO("%d words in transcripts\n",n_totalwds);
    E_INFO("%d single word triphones in transcripts\n",nswdtphns);
    E_INFO("%d word beginning triphones in transcripts\n",nbwdtphns);
    E_INFO("%d word internal triphones in transcripts\n",niwdtphns);
    E_INFO("%d word ending triphones in transcripts\n",newdtphns);

    return S3_SUCCESS;
}